

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O3

void destroy_expectation_if_time_to_die(RecordedExpectation *expectation)

{
  char *__s2;
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  
  iVar1 = expectation->time_to_live;
  if ((iVar1 == 0xf314159) || (expectation->time_to_live = iVar1 + -1, 1 < iVar1)) {
    return;
  }
  __s2 = expectation->function;
  iVar1 = cgreen_vector_size(global_expectation_queue);
  if (0 < iVar1) {
    iVar1 = 0;
    do {
      puVar3 = (undefined8 *)cgreen_vector_get(global_expectation_queue,iVar1);
      if (puVar3 == (undefined8 *)0x0) {
        __fprintf_chk(_stderr,1,
                      "*** CGREEN: NULL expectation found -- maybe a previous incorrect removal?");
      }
      else {
        iVar2 = strcmp((char *)*puVar3,__s2);
        if (iVar2 == 0) {
          cgreen_vector_remove(global_expectation_queue,iVar1);
          break;
        }
      }
      iVar1 = iVar1 + 1;
      iVar2 = cgreen_vector_size(global_expectation_queue);
    } while (iVar1 < iVar2);
  }
  destroy_cgreen_vector(expectation->constraints);
  free(expectation);
  return;
}

Assistant:

static void destroy_expectation_if_time_to_die(RecordedExpectation *expectation) {

    if (is_always_call(expectation)) {
        return;
    }

    /* TODO: expectation->decrement_time_to_live_if_necessary(); if (expectation->time_to_die()) { ... } */
    expectation->time_to_live--;

    if (expectation->time_to_live <= 0) {
        remove_expectation_for(expectation->function);
        destroy_expectation(expectation);
    }
}